

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* ParseMountInfo(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *__return_storage_ptr__,
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys>_>_>
                *subsystems)

{
  pointer *this;
  byte bVar1;
  bool bVar2;
  size_type sVar3;
  reference this_00;
  pointer ppVar4;
  ulong uVar5;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a0;
  undefined1 local_360 [8];
  string newPath;
  _Self local_338;
  iterator subsys;
  string opt;
  size_t i;
  undefined1 local_2f8 [8];
  MountPoint mp;
  string line;
  istream local_228 [8];
  ifstream mountinfo;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys>_>_>
  *subsystems_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *cgroups;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(__return_storage_ptr__);
  std::ifstream::ifstream(local_228,"/proc/self/mountinfo",8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
      this = &mp.superOptions.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::string((string *)this);
      std::getline<char,std::char_traits<char>,std::allocator<char>>(local_228,(string *)this);
      MountPoint::MountPoint((MountPoint *)local_2f8);
      bVar2 = MountPoint::parse((MountPoint *)local_2f8,
                                (string *)
                                &mp.superOptions.
                                 super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar2) {
        StringPiece::StringPiece((StringPiece *)&i,"cgroup");
        bVar2 = StringPiece::operator!=
                          ((StringPiece *)
                           &mp.optionalFields.
                            super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(StringPiece *)&i);
        if (!bVar2) {
          for (opt.field_2._8_8_ = 0;
              sVar3 = std::vector<StringPiece,_std::allocator<StringPiece>_>::size
                                ((vector<StringPiece,_std::allocator<StringPiece>_> *)
                                 &mp.mountSource.len_), (ulong)opt.field_2._8_8_ < sVar3;
              opt.field_2._8_8_ = opt.field_2._8_8_ + 1) {
            this_00 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                                ((vector<StringPiece,_std::allocator<StringPiece>_> *)
                                 &mp.mountSource.len_,opt.field_2._8_8_);
            StringPiece::AsString_abi_cxx11_((string *)&subsys,this_00);
            local_338._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys>_>_>
                 ::find(subsystems,(key_type *)&subsys);
            newPath.field_2._8_8_ =
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys>_>_>
                 ::end(subsystems);
            bVar2 = std::operator==(&local_338,(_Self *)((long)&newPath.field_2 + 8));
            if (!bVar2) {
              ppVar4 = std::
                       _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys>_>
                       ::operator->(&local_338);
              MountPoint::translate
                        ((string *)local_360,(MountPoint *)local_2f8,&(ppVar4->second).name);
              uVar5 = std::__cxx11::string::empty();
              if ((uVar5 & 1) == 0) {
                std::make_pair<std::__cxx11::string&,std::__cxx11::string&>
                          (&local_3a0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &subsys,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_360);
                std::
                map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)__return_storage_ptr__,&local_3a0);
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~pair(&local_3a0);
              }
              std::__cxx11::string::~string((string *)local_360);
            }
            std::__cxx11::string::~string((string *)&subsys);
          }
        }
      }
      MountPoint::~MountPoint((MountPoint *)local_2f8);
      std::__cxx11::string::~string
                ((string *)
                 &mp.superOptions.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  std::ifstream::~ifstream(local_228);
  return __return_storage_ptr__;
}

Assistant:

map<string, string> ParseMountInfo(map<string, CGroupSubSys>& subsystems) {
  map<string, string> cgroups;
  ifstream mountinfo("/proc/self/mountinfo");
  if (!mountinfo.is_open())
    return cgroups;
  while (!mountinfo.eof()) {
    string line;
    getline(mountinfo, line);
    MountPoint mp;
    if (!mp.parse(line))
      continue;
    if (mp.fsType != "cgroup")
      continue;
    for (size_t i = 0; i < mp.superOptions.size(); i++) {
      string opt = mp.superOptions[i].AsString();
      map<string, CGroupSubSys>::iterator subsys = subsystems.find(opt);
      if (subsys == subsystems.end())
        continue;
      string newPath = mp.translate(subsys->second.name);
      if (!newPath.empty())
        cgroups.insert(make_pair(opt, newPath));
    }
  }
  return cgroups;
}